

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O0

EStatusCode __thiscall
ShadingWriter::WriteAlphaSoftMaskExtGStateObject
          (ShadingWriter *this,PDFRectangle *inBounds,PDFMatrix *inMatrix,
          ObjectIDType inAlphaShadingPatternObjectId,ObjectIDType inExtGStateObjectId)

{
  IndirectObjectsReferenceRegistry *this_00;
  DictionaryContext *pDVar1;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  DictionaryContext *local_d8;
  DictionaryContext *smaskDict;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  DictionaryContext *local_48;
  DictionaryContext *extGStateDict;
  ObjectIDType smaskFormObjectId;
  ObjectIDType OStack_30;
  EStatusCode status;
  ObjectIDType inExtGStateObjectId_local;
  ObjectIDType inAlphaShadingPatternObjectId_local;
  PDFMatrix *inMatrix_local;
  PDFRectangle *inBounds_local;
  ShadingWriter *this_local;
  
  smaskFormObjectId._4_4_ = 0;
  OStack_30 = inExtGStateObjectId;
  inExtGStateObjectId_local = inAlphaShadingPatternObjectId;
  inAlphaShadingPatternObjectId_local = (ObjectIDType)inMatrix;
  inMatrix_local = (PDFMatrix *)inBounds;
  inBounds_local = (PDFRectangle *)this;
  this_00 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
  extGStateDict =
       (DictionaryContext *)IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_00);
  smaskFormObjectId._4_4_ = ObjectsContext::StartNewIndirectObject(this->mObjectsContext,OStack_30);
  if (smaskFormObjectId._4_4_ == eSuccess) {
    pDVar1 = ObjectsContext::StartDictionary(this->mObjectsContext);
    local_48 = pDVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Type",&local_69);
    DictionaryContext::WriteKey(pDVar1,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    pDVar1 = local_48;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"ExtGState",&local_a1);
    DictionaryContext::WriteNameValue(pDVar1,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    pDVar1 = local_48;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"SMask",(allocator<char> *)((long)&smaskDict + 7));
    DictionaryContext::WriteKey(pDVar1,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&smaskDict + 7));
    pDVar1 = ObjectsContext::StartDictionary(this->mObjectsContext);
    local_d8 = pDVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"Type",&local_f9);
    DictionaryContext::WriteKey(pDVar1,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    pDVar1 = local_d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"Mask",&local_121);
    DictionaryContext::WriteNameValue(pDVar1,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    pDVar1 = local_d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"S",&local_149);
    DictionaryContext::WriteKey(pDVar1,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
    pDVar1 = local_d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"Luminosity",&local_171)
    ;
    DictionaryContext::WriteNameValue(pDVar1,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    pDVar1 = local_d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"G",&local_199);
    DictionaryContext::WriteKey(pDVar1,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    DictionaryContext::WriteNewObjectReferenceValue(local_d8,(ObjectIDType)extGStateDict);
    smaskFormObjectId._4_4_ = ObjectsContext::EndDictionary(this->mObjectsContext,local_d8);
    if ((smaskFormObjectId._4_4_ == eSuccess) &&
       (smaskFormObjectId._4_4_ = ObjectsContext::EndDictionary(this->mObjectsContext,local_48),
       smaskFormObjectId._4_4_ == eSuccess)) {
      ObjectsContext::EndIndirectObject(this->mObjectsContext);
      smaskFormObjectId._4_4_ =
           WriteAlphaSoftMaskXObjectFormObject
                     (this,(PDFRectangle *)inMatrix_local,
                      (PDFMatrix *)inAlphaShadingPatternObjectId_local,inExtGStateObjectId_local,
                      (ObjectIDType)extGStateDict);
    }
  }
  return smaskFormObjectId._4_4_;
}

Assistant:

PDFHummus::EStatusCode ShadingWriter::WriteAlphaSoftMaskExtGStateObject(
    const PDFRectangle& inBounds,
    const PDFMatrix& inMatrix,
    ObjectIDType inAlphaShadingPatternObjectId,
    ObjectIDType inExtGStateObjectId
) {
    EStatusCode status = eSuccess;

    do {
        ObjectIDType smaskFormObjectId = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();

        // write ExtGState with soft mask reference
        status = mObjectsContext->StartNewIndirectObject(inExtGStateObjectId);
        if(status != eSuccess)
            break;
        DictionaryContext* extGStateDict = mObjectsContext->StartDictionary();

        extGStateDict->WriteKey("Type");
        extGStateDict->WriteNameValue("ExtGState");
        extGStateDict->WriteKey("SMask");
        DictionaryContext* smaskDict = mObjectsContext->StartDictionary();
        
        smaskDict->WriteKey("Type");
        smaskDict->WriteNameValue("Mask");
        smaskDict->WriteKey("S");
        smaskDict->WriteNameValue("Luminosity");
        smaskDict->WriteKey("G");
        smaskDict->WriteNewObjectReferenceValue(smaskFormObjectId);
        status = mObjectsContext->EndDictionary(smaskDict);
        if(status != eSuccess)
            break;
        status = mObjectsContext->EndDictionary(extGStateDict);
        if(status != eSuccess)
            break;
        mObjectsContext->EndIndirectObject();

        status = WriteAlphaSoftMaskXObjectFormObject(
            inBounds,
            inMatrix,
            inAlphaShadingPatternObjectId,
            smaskFormObjectId  
        );

    } while(false);

    return status;    
}